

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::UnblindTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
          *txout_unblind_keys,
          vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>
          *issuance_blind_keys,
          vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *blind_outputs
          ,vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>
           *issuance_outputs)

{
  Txid *pTVar1;
  undefined8 uVar2;
  uint32_t tx_in_index;
  ConfidentialTransaction *pCVar3;
  uint32_t *puVar4;
  Txid *object;
  UnblindParameter unblind_param;
  Privkey_conflict blinding_key;
  undefined1 local_1c0 [16];
  _func_int *local_1b0 [2];
  uint32_t local_1a0;
  undefined1 local_198 [16];
  pointer local_188;
  undefined1 local_178 [8];
  undefined1 local_170 [32];
  undefined1 local_150 [16];
  pointer local_140;
  ConfidentialValue local_120;
  vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_> *local_f8;
  vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *local_f0;
  uint32_t *local_e8;
  ConfidentialAssetId local_e0;
  BlindFactor local_b8;
  BlindFactor local_98;
  ConfidentialValue local_78;
  Privkey local_50;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  local_f0 = blind_outputs;
  if ((blind_outputs !=
       (vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *)0x0) &&
     (*(long *)txout_unblind_keys != *(long *)(txout_unblind_keys + 8))) {
    core::ConfidentialAssetId::ConfidentialAssetId(&local_e0);
    core::BlindFactor::BlindFactor(&local_b8);
    core::BlindFactor::BlindFactor(&local_98);
    local_f8 = issuance_blind_keys;
    core::ConfidentialValue::ConfidentialValue(&local_78);
    puVar4 = *(uint32_t **)txout_unblind_keys;
    local_e8 = *(uint32_t **)(txout_unblind_keys + 8);
    if (puVar4 != local_e8) {
      do {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar4 + 2));
        local_50._24_8_ = *(undefined8 *)(puVar4 + 8);
        ConfidentialTransactionController::UnblindTxOut
                  ((UnblindParameter *)local_1c0,__return_storage_ptr__,*puVar4,&local_50);
        core::ConfidentialAssetId::operator=(&local_e0,(ConfidentialAssetId *)local_1c0);
        core::BlindFactor::operator=(&local_b8,(BlindFactor *)local_198);
        core::BlindFactor::operator=(&local_98,(BlindFactor *)local_178);
        core::ConfidentialValue::operator=(&local_78,(ConfidentialValue *)(local_170 + 0x18));
        local_170._24_8_ = &PTR__ConfidentialValue_00723840;
        if ((_func_int **)local_150._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_150._0_8_);
        }
        local_178 = (undefined1  [8])&PTR__BlindFactor_00723500;
        if ((_func_int **)local_170._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_170._0_8_);
        }
        local_198._0_8_ = &PTR__BlindFactor_00723500;
        if ((_func_int **)local_198._8_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_198._8_8_);
        }
        local_1c0._0_8_ = &PTR__ConfidentialAssetId_00723760;
        if ((_func_int **)local_1c0._8_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_1c0._8_8_);
        }
        core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1c0,&local_e0);
        uVar2 = local_1c0._8_8_;
        if ((_func_int **)local_1c0._0_8_ != local_1b0) {
          operator_delete((void *)local_1c0._0_8_);
        }
        if ((_func_int **)uVar2 != (_func_int **)0x0) {
          core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)(local_1c0 + 8));
          core::BlindFactor::BlindFactor((BlindFactor *)(local_198 + 8));
          core::BlindFactor::BlindFactor((BlindFactor *)local_170);
          core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_150);
          local_1c0._0_4_ = *puVar4;
          core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_1c0 + 8),&local_e0);
          core::BlindFactor::operator=((BlindFactor *)local_170,&local_98);
          core::BlindFactor::operator=((BlindFactor *)(local_198 + 8),&local_b8);
          core::ConfidentialValue::operator=((ConfidentialValue *)local_150,&local_78);
          std::vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_>::
          push_back(local_f0,(value_type *)local_1c0);
          local_150._0_8_ = &PTR__ConfidentialValue_00723840;
          if ((_func_int **)local_150._8_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_150._8_8_);
          }
          local_170._0_8_ = &PTR__BlindFactor_00723500;
          if ((pointer)local_170._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_170._8_8_);
          }
          local_198._8_8_ = &PTR__BlindFactor_00723500;
          if (local_188 != (pointer)0x0) {
            operator_delete(local_188);
          }
          local_1c0._8_8_ = &PTR__ConfidentialAssetId_00723760;
          if (local_1b0[0] != (_func_int *)0x0) {
            operator_delete(local_1b0[0]);
          }
        }
        if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        puVar4 = puVar4 + 10;
      } while (puVar4 != local_e8);
    }
    local_78._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    issuance_blind_keys = local_f8;
    local_98._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_b8._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_e0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  object = *(Txid **)issuance_blind_keys;
  pTVar1 = *(Txid **)(issuance_blind_keys + 8);
  if (issuance_outputs !=
      (vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_> *
      )0x0 && object != pTVar1) {
    do {
      pCVar3 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
      core::Txid::Txid((Txid *)local_1c0,object);
      tx_in_index = (*(pCVar3->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                              (pCVar3,(UnblindIssuanceOutputs *)local_1c0,
                               (ulong)*(uint *)&object[1]._vptr_Txid);
      local_1c0._0_8_ = &PTR__Txid_00723450;
      if ((_func_int **)local_1c0._8_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1c0._8_8_);
      }
      ConfidentialTransactionController::UnblindIssuance
                ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  *)&local_e0,__return_storage_ptr__,tx_in_index,(Privkey *)&object[1].data_,
                 (Privkey *)&object[2].data_);
      UnblindIssuanceOutputs::UnblindIssuanceOutputs((UnblindIssuanceOutputs *)local_1c0);
      core::Txid::operator=((Txid *)local_1c0,object);
      local_1a0 = *(uint32_t *)&object[1]._vptr_Txid;
      core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)local_198,
                 (ConfidentialAssetId *)local_e0._vptr_ConfidentialAssetId);
      core::ConfidentialValue::operator=
                ((ConfidentialValue *)local_170,
                 (ConfidentialValue *)
                 &(((ConfidentialAssetId *)((long)local_e0._vptr_ConfidentialAssetId + 0x50))->data_
                  ).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (1 < (ulong)(((long)local_e0.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start -
                       (long)local_e0._vptr_ConfidentialAssetId >> 4) * -0x71c71c71c71c71c7)) {
        core::ConfidentialAssetId::operator=
                  ((ConfidentialAssetId *)(local_150 + 8),
                   (ConfidentialAssetId *)
                   &(((ConfidentialAssetId *)((long)local_e0._vptr_ConfidentialAssetId + 0x78))->
                    data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        core::ConfidentialValue::operator=
                  (&local_120,
                   (ConfidentialValue *)
                   &((ConfidentialAssetId *)((long)local_e0._vptr_ConfidentialAssetId + 0xf0))->
                    data_);
      }
      std::
      vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>::
      push_back(issuance_outputs,(UnblindIssuanceOutputs *)local_1c0);
      local_120._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
      if (local_120.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_150._8_8_ = &PTR__ConfidentialAssetId_00723760;
      if (local_140 != (pointer)0x0) {
        operator_delete(local_140);
      }
      local_170._0_8_ = &PTR__ConfidentialValue_00723840;
      if ((pointer)local_170._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_170._8_8_);
      }
      local_198._0_8_ = &PTR__ConfidentialAssetId_00723760;
      if ((_func_int **)local_198._8_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_198._8_8_);
      }
      local_1c0._0_8_ = &PTR__Txid_00723450;
      if ((_func_int **)local_1c0._8_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1c0._8_8_);
      }
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              &local_e0);
      object = (Txid *)&object[3].data_;
    } while (object != pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::UnblindTransaction(
    const std::string& tx_hex,
    const std::vector<TxOutUnblindKeys>& txout_unblind_keys,
    const std::vector<IssuanceBlindKeys>& issuance_blind_keys,
    std::vector<UnblindOutputs>* blind_outputs,
    std::vector<UnblindIssuanceOutputs>* issuance_outputs) {
  ConfidentialTransactionController ctxc(tx_hex);

  if (!txout_unblind_keys.empty() && blind_outputs != nullptr) {
    UnblindParameter unblind_param;
    for (const auto& txout : txout_unblind_keys) {
      // TxOutをUnblind
      const Privkey blinding_key(txout.blinding_key);
      unblind_param = ctxc.UnblindTxOut(txout.index, blinding_key);

      if (!unblind_param.asset.GetHex().empty()) {
        UnblindOutputs output;
        output.index = txout.index;
        output.blind_param.asset = unblind_param.asset;
        output.blind_param.vbf = unblind_param.vbf;
        output.blind_param.abf = unblind_param.abf;
        output.blind_param.value = unblind_param.value;
        blind_outputs->push_back(output);
      }
    }
  }

  if (!issuance_blind_keys.empty() && issuance_outputs != nullptr) {
    for (const auto& issuance : issuance_blind_keys) {
      uint32_t txin_index = ctxc.GetTransaction().GetTxInIndex(
          Txid(issuance.txid), issuance.vout);

      std::vector<UnblindParameter> issuance_param = ctxc.UnblindIssuance(
          txin_index, issuance.issuance_key.asset_key,
          issuance.issuance_key.token_key);

      UnblindIssuanceOutputs output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.asset = issuance_param[0].asset;
      output.asset_amount = issuance_param[0].value;
      if (issuance_param.size() > 1) {
        output.token = issuance_param[1].asset;
        output.token_amount = issuance_param[1].value;
      }
      issuance_outputs->push_back(output);
    }
  }
  return ctxc;
}